

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dir.cpp
# Opt level: O1

void just_test_test_case_f_test_can_create_files_in_temp_dir(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string p;
  directory d;
  ofstream f;
  long *local_2a8 [2];
  long local_298 [2];
  long *local_288;
  long local_280;
  long local_278 [2];
  assert_msg local_268;
  directory local_240;
  long local_220;
  filebuf local_218 [24];
  byte abStack_200 [216];
  ios_base local_128 [264];
  
  just::temp::directory::directory(&local_240);
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a8,local_240._path._M_dataplus._M_p,
             local_240._path._M_dataplus._M_p + local_240._path._M_string_length);
  std::__cxx11::string::append((char *)local_2a8);
  std::ofstream::ofstream(&local_220,(char *)local_2a8[0],_S_out);
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/temp/test/test_dir.cpp"
             ,"");
  paVar1 = &local_268._filename.field_2;
  local_268._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268._line = 0x4b;
  just::test::assert_msg::operator()
            (&local_268,(abStack_200[*(long *)(local_220 + -0x18)] & 5) == 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._filename._M_dataplus._M_p,
                    local_268._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0],local_298[0] + 1);
  }
  just::temp::directory::~directory(&local_240);
  return;
}

Assistant:

JUST_TEST_CASE(test_can_create_files_in_temp_dir)
{
  const temp::directory d;

  const std::string p = d.path() + "/test.txt";
  std::ofstream f(p.c_str());

  JUST_ASSERT(!f.fail());
}